

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

DynamicType *
Js::DynamicType::New
          (ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
          JavascriptMethod entryPoint,DynamicTypeHandler *typeHandler,bool isLocked,bool isShared)

{
  Recycler *pRVar1;
  DynamicType *this;
  TrackAllocData local_60;
  byte local_32;
  byte local_31;
  bool isShared_local;
  DynamicTypeHandler *pDStack_30;
  bool isLocked_local;
  DynamicTypeHandler *typeHandler_local;
  JavascriptMethod entryPoint_local;
  RecyclableObject *prototype_local;
  ScriptContext *pSStack_10;
  TypeId typeId_local;
  ScriptContext *scriptContext_local;
  
  local_32 = isShared;
  local_31 = isLocked;
  pDStack_30 = typeHandler;
  typeHandler_local = (DynamicTypeHandler *)entryPoint;
  entryPoint_local = (JavascriptMethod)prototype;
  prototype_local._4_4_ = typeId;
  pSStack_10 = scriptContext;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
             ,0x25);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_60);
  this = (DynamicType *)new<Memory::Recycler>(0x38,pRVar1,0x43c4b0);
  DynamicType(this,pSStack_10,prototype_local._4_4_,(RecyclableObject *)entryPoint_local,
              (JavascriptMethod)typeHandler_local,pDStack_30,(bool)(local_31 & 1),
              (bool)(local_32 & 1));
  return this;
}

Assistant:

DynamicType *
    DynamicType::New(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint, DynamicTypeHandler * typeHandler, bool isLocked, bool isShared)
    {
        return RecyclerNew(scriptContext->GetRecycler(), DynamicType, scriptContext, typeId, prototype, entryPoint, typeHandler, isLocked, isShared);
    }